

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerMessageDeflate.h
# Opt level: O0

void __thiscall uWS::DeflationStream::DeflationStream(DeflationStream *this,int compressOptions)

{
  int in_ESI;
  undefined8 *in_RDI;
  int memLevel;
  int windowBits;
  undefined4 local_14;
  undefined4 local_10;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  if (in_ESI == 6) {
    local_10 = 0xfffffff7;
    local_14 = 1;
  }
  else if (in_ESI == 10) {
    local_10 = 0xfffffff7;
    local_14 = 2;
  }
  else if (in_ESI == 0x12) {
    local_10 = 0xfffffff6;
    local_14 = 3;
  }
  else if (in_ESI == 0x22) {
    local_10 = 0xfffffff5;
    local_14 = 4;
  }
  else if (in_ESI == 0x42) {
    local_10 = 0xfffffff4;
    local_14 = 5;
  }
  else if (in_ESI == 0x82) {
    local_10 = 0xfffffff3;
    local_14 = 6;
  }
  else if (in_ESI == 0x102) {
    local_10 = 0xfffffff2;
    local_14 = 7;
  }
  else {
    local_10 = 0xfffffff1;
    local_14 = 8;
  }
  deflateInit2_(in_RDI,1,8,local_10,local_14,0,"1.2.11",0x70);
  return;
}

Assistant:

DeflationStream(int compressOptions) {

        /* Sliding inflator should be about 44kb by default, less than compressor */

        /* Memory usage is given by 2 ^ (windowBits + 2) + 2 ^ (memLevel + 9) */
        int windowBits = -15, memLevel = 8;

        if (compressOptions == DEDICATED_COMPRESSOR_3KB) {
            windowBits = -9;
            memLevel = 1;
        } else if (compressOptions == DEDICATED_COMPRESSOR_4KB) {
            windowBits = -9;
            memLevel = 2;
        } else if (compressOptions == DEDICATED_COMPRESSOR_8KB) {
            windowBits = -10;
            memLevel = 3;
        } else if (compressOptions == DEDICATED_COMPRESSOR_16KB) {
            windowBits = -11;
            memLevel = 4;
        } else if (compressOptions == DEDICATED_COMPRESSOR_32KB) {
            windowBits = -12;
            memLevel = 5;
        } else if (compressOptions == DEDICATED_COMPRESSOR_64KB) {
            windowBits = -13;
            memLevel = 6;
        } else if (compressOptions == DEDICATED_COMPRESSOR_128KB) {
            windowBits = -14;
            memLevel = 7;
        } else if (compressOptions == DEDICATED_COMPRESSOR_256KB) {
            windowBits = -15;
            memLevel = 8;
        }

        /* DEDICATED_COMPRESSOR_256KB is the same as DEDICATED_COMPRESSOR */

        deflateInit2(&deflationStream, 1, Z_DEFLATED, windowBits, memLevel, Z_DEFAULT_STRATEGY);
    }